

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall qpdf::BaseHandle::write_json(BaseHandle *this,int json_version,Writer *p)

{
  _Rb_tree_color _Var1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  pair<bool,_bool> pVar5;
  qpdf_object_type_e qVar6;
  variant_alternative_t<10UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar7;
  variant_alternative_t<5UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  string *psVar9;
  variant_alternative_t<9UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar10;
  _Base_ptr p_Var11;
  variant_alternative_t<3UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar12;
  variant_alternative_t<4UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar13;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar14;
  variant_alternative_t<6UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *this_00;
  Writer *pWVar15;
  logic_error *this_01;
  size_type sVar16;
  int j;
  int iVar17;
  char *pcVar18;
  pointer pcVar19;
  Pipeline *pPVar20;
  _Rb_tree_node_base *p_Var21;
  QPDFObjectHandle *item;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_02;
  string local_80;
  _Rb_tree_node_base *local_60;
  QPDFObjGen item_og;
  
  qVar6 = resolved_type_code(this);
  switch(qVar6) {
  case ot_uninitialized:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,"QPDFObjectHandle: attempting to get JSON from a uninitialized object");
    goto LAB_0019a08e;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"attempted to write an unsuitable object as JSON");
LAB_0019a08e:
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case ot_null:
  case ot_operator:
  case ot_inlineimage:
    pcVar18 = "null";
LAB_001998cd:
    JSON::Writer::operator<<(p,pcVar18);
    return;
  case ot_boolean:
    pvVar12 = std::
              get<3ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    JSON::Writer::operator<<(p,pvVar12->val);
    return;
  case ot_integer:
    pvVar13 = std::
              get<4ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    std::__cxx11::to_string(&local_80,pvVar13->val);
    (*p->p->_vptr_Pipeline[2])
              (p->p,CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
               local_80._M_string_length);
    break;
  case ot_real:
    pvVar8 = std::
             get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->value);
    if ((pvVar8->val)._M_string_length == 0) {
      JSON::Writer::operator<<(p,"0");
    }
    else {
      pcVar18 = (char *)std::__cxx11::string::at((ulong)pvVar8);
      if (*pcVar18 == '.') {
        pWVar15 = JSON::Writer::operator<<(p,"0");
        pcVar19 = (pvVar8->val)._M_dataplus._M_p;
        sVar16 = (pvVar8->val)._M_string_length;
        pPVar20 = pWVar15->p;
      }
      else {
        if (((1 < (pvVar8->val)._M_string_length) &&
            (pcVar18 = (char *)std::__cxx11::string::at((ulong)pvVar8), *pcVar18 == '-')) &&
           (pcVar18 = (char *)std::__cxx11::string::at((ulong)pvVar8), *pcVar18 == '.')) {
          pWVar15 = JSON::Writer::operator<<(p,"-0.");
          std::__cxx11::string::substr((ulong)&local_80,(ulong)pvVar8);
          (*pWVar15->p->_vptr_Pipeline[2])
                    (pWVar15->p,
                     CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                     local_80._M_string_length);
          std::__cxx11::string::~string((string *)&local_80);
          goto LAB_00199fa9;
        }
        pcVar19 = (pvVar8->val)._M_dataplus._M_p;
        sVar16 = (pvVar8->val)._M_string_length;
        pPVar20 = p->p;
      }
      (*pPVar20->_vptr_Pipeline[2])(pPVar20,pcVar19,sVar16);
    }
LAB_00199fa9:
    if ((pvVar8->val)._M_dataplus._M_p[(pvVar8->val)._M_string_length - 1] != '.') {
      return;
    }
    JSON::Writer::operator<<(p,"0");
    return;
  case ot_string:
    this_00 = std::
              get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    QPDF_String::writeJSON(this_00,json_version,p);
    return;
  case ot_name:
    psVar9 = &std::
              get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value)->name;
    if (json_version == 1) {
      pWVar15 = JSON::Writer::operator<<(p,"\"");
      Name::normalize((string *)&item_og,psVar9);
      JSON::Writer::encode_string(&local_80,(string *)&item_og);
      (*pWVar15->p->_vptr_Pipeline[2])
                (pWVar15->p,
                 CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                 local_80._M_string_length);
      JSON::Writer::operator<<(pWVar15,"\"");
    }
    else {
      pVar5 = Name::analyzeJSONEncoding(psVar9);
      if (((ushort)pVar5 & 1) != 0) {
        p = JSON::Writer::operator<<(p,"\"");
        if (((ushort)pVar5 >> 8 & 1) != 0) {
          (*p->p->_vptr_Pipeline[2])(p->p,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
          pcVar18 = "\"";
          goto LAB_001998cd;
        }
        JSON::Writer::encode_string(&local_80,psVar9);
        (*p->p->_vptr_Pipeline[2])
                  (p->p,CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                   local_80._M_string_length);
        JSON::Writer::operator<<(p,"\"");
        break;
      }
      pWVar15 = JSON::Writer::operator<<(p,"\"n:");
      Name::normalize((string *)&item_og,psVar9);
      JSON::Writer::encode_string(&local_80,(string *)&item_og);
      (*pWVar15->p->_vptr_Pipeline[2])
                (pWVar15->p,
                 CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                 local_80._M_string_length);
      JSON::Writer::operator<<(pWVar15,"\"");
    }
    std::__cxx11::string::~string((string *)&local_80);
    psVar9 = (string *)&item_og;
    goto LAB_0019a028;
  case ot_array:
    pvVar14 = std::
              get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    local_80._M_dataplus._M_p._0_1_ = 0x5b;
    JSON::Writer::writeStart(p,(char *)&local_80);
    _Var2._M_head_impl =
         (pvVar14->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var2._M_head_impl == (Sparse *)0x0) {
      p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               (pvVar14->elements).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                     (pvVar14->elements).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start; this_02 != p_Var3; this_02 = this_02 + 1) {
        JSON::Writer::writeNext(p);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80,this_02);
        item_og = *(QPDFObjGen *)
                   (CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) + 0x50
                   );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
        if (item_og.obj == 0) {
          write_json((BaseHandle *)this_02,json_version,p);
        }
        else {
          pWVar15 = JSON::Writer::operator<<(p,"\"");
          QPDFObjGen::unparse_abi_cxx11_(&local_80,&item_og,' ');
          (*pWVar15->p->_vptr_Pipeline[2])
                    (pWVar15->p,
                     CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                     local_80._M_string_length);
          JSON::Writer::operator<<(pWVar15," R\"");
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
    }
    else {
      local_60 = &((_Var2._M_head_impl)->elements)._M_t._M_impl.super__Rb_tree_header._M_header;
      iVar17 = 0;
      for (p_Var11 = ((_Var2._M_head_impl)->elements)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left; p_Var11 != local_60;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        _Var1 = p_Var11[1]._M_color;
        for (; pWVar15 = JSON::Writer::writeNext(p), iVar17 < (int)_Var1; iVar17 = iVar17 + 1) {
          JSON::Writer::operator<<(pWVar15,"null");
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p_Var11[1]._M_parent);
        item_og = *(QPDFObjGen *)
                   (CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) + 0x50
                   );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
        if (item_og.obj == 0) {
          write_json((BaseHandle *)&p_Var11[1]._M_parent,json_version,p);
        }
        else {
          pWVar15 = JSON::Writer::operator<<(p,"\"");
          QPDFObjGen::unparse_abi_cxx11_(&local_80,&item_og,' ');
          (*pWVar15->p->_vptr_Pipeline[2])
                    (pWVar15->p,
                     CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                     local_80._M_string_length);
          JSON::Writer::operator<<(pWVar15," R\"");
          std::__cxx11::string::~string((string *)&local_80);
        }
        iVar17 = _Var1 + _S_black;
      }
      for (; iVar17 < ((pvVar14->sp)._M_t.
                       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                       .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->size;
          iVar17 = iVar17 + 1) {
        pWVar15 = JSON::Writer::writeNext(p);
        JSON::Writer::operator<<(pWVar15,"null");
      }
    }
    local_80._M_dataplus._M_p._0_1_ = 0x5d;
    goto LAB_00199f20;
  case ot_dictionary:
    pvVar10 = std::
              get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    local_80._M_dataplus._M_p._0_1_ = 0x7b;
    JSON::Writer::writeStart(p,(char *)&local_80);
    p_Var21 = &(pvVar10->items)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_60 = p_Var21;
    for (p_Var11 = (pvVar10->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var11 != p_Var21; p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      bVar4 = null((BaseHandle *)(p_Var11 + 2));
      if (!bVar4) {
        p_Var21 = p_Var11 + 1;
        JSON::Writer::writeNext(p);
        if (json_version == 1) {
          pWVar15 = JSON::Writer::operator<<(p,"\"");
          Name::normalize((string *)&item_og,(string *)p_Var21);
          JSON::Writer::encode_string(&local_80,(string *)&item_og);
          (*pWVar15->p->_vptr_Pipeline[2])
                    (pWVar15->p,
                     CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                     local_80._M_string_length);
          p_Var21 = local_60;
          JSON::Writer::operator<<(pWVar15,"\": ");
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&item_og);
        }
        else {
          pVar5 = Name::analyzeJSONEncoding((string *)p_Var21);
          if (((ushort)pVar5 & 1) == 0) {
            pWVar15 = JSON::Writer::operator<<(p,"\"n:");
            Name::normalize((string *)&item_og,(string *)p_Var21);
            JSON::Writer::encode_string(&local_80,(string *)&item_og);
            (*pWVar15->p->_vptr_Pipeline[2])
                      (pWVar15->p,
                       CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                       local_80._M_string_length);
            p_Var21 = local_60;
            JSON::Writer::operator<<(pWVar15,"\": ");
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&item_og);
          }
          else {
            pWVar15 = JSON::Writer::operator<<(p,"\"");
            if (((ushort)pVar5 >> 8 & 1) == 0) {
              JSON::Writer::encode_string(&local_80,(string *)p_Var21);
              (*pWVar15->p->_vptr_Pipeline[2])
                        (pWVar15->p,
                         CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
                         local_80._M_string_length);
              JSON::Writer::operator<<(pWVar15,"\": ");
              std::__cxx11::string::~string((string *)&local_80);
              p_Var21 = local_60;
            }
            else {
              (*pWVar15->p->_vptr_Pipeline[2])
                        (pWVar15->p,*(undefined8 *)(p_Var11 + 1),p_Var11[1]._M_parent);
              JSON::Writer::operator<<(pWVar15,"\": ");
              p_Var21 = local_60;
            }
          }
        }
        QPDFObjectHandle::writeJSON((QPDFObjectHandle *)(p_Var11 + 2),json_version,p,false);
      }
    }
    local_80._M_dataplus._M_p._0_1_ = 0x7d;
LAB_00199f20:
    JSON::Writer::writeEnd(p,(char *)&local_80);
    return;
  case ot_stream:
    pvVar7 = std::
             get<10ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                       (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->value);
    QPDFObjectHandle::writeJSON
              (&((pvVar7->m)._M_t.
                 super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>
                 .super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl)->stream_dict,
               json_version,p,false);
    return;
  case ot_reference:
    pWVar15 = JSON::Writer::operator<<(p,"\"");
    QPDFObjGen::unparse_abi_cxx11_
              (&local_80,
               &((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og,
               ' ');
    (*pWVar15->p->_vptr_Pipeline[2])
              (pWVar15->p,CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_),
               local_80._M_string_length);
    JSON::Writer::operator<<(pWVar15," R\"");
  }
  psVar9 = &local_80;
LAB_0019a028:
  std::__cxx11::string::~string((string *)psVar9);
  return;
}

Assistant:

void
BaseHandle::write_json(int json_version, JSON::Writer& p) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error(
            "QPDFObjectHandle: attempting to get JSON from a uninitialized object");
        break; // unreachable
    case ::ot_null:
    case ::ot_operator:
    case ::ot_inlineimage:
        p << "null";
        break;
    case ::ot_boolean:
        p << std::get<QPDF_Bool>(obj->value).val;
        break;
    case ::ot_integer:
        p << std::to_string(std::get<QPDF_Integer>(obj->value).val);
        break;
    case ::ot_real:
        {
            auto const& val = std::get<QPDF_Real>(obj->value).val;
            if (val.length() == 0) {
                // Can't really happen...
                p << "0";
            } else if (val.at(0) == '.') {
                p << "0" << val;
            } else if (val.length() >= 2 && val.at(0) == '-' && val.at(1) == '.') {
                p << "-0." << val.substr(2);
            } else {
                p << val;
            }
            if (val.back() == '.') {
                p << "0";
            }
        }
        break;
    case ::ot_string:
        std::get<QPDF_String>(obj->value).writeJSON(json_version, p);
        break;
    case ::ot_name:
        {
            auto const& n = std::get<QPDF_Name>(obj->value);
            // For performance reasons this code is duplicated in QPDF_Dictionary::writeJSON. When
            // updating this method make sure QPDF_Dictionary is also update.
            if (json_version == 1) {
                p << "\"" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
            } else {
                if (auto res = Name::analyzeJSONEncoding(n.name); res.first) {
                    if (res.second) {
                        p << "\"" << n.name << "\"";
                    } else {
                        p << "\"" << JSON::Writer::encode_string(n.name) << "\"";
                    }
                } else {
                    p << "\"n:" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
                }
            }
        }
        break;
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            p.writeStart('[');
            if (a.sp) {
                int next = 0;
                for (auto& item: a.sp->elements) {
                    int key = item.first;
                    for (int j = next; j < key; ++j) {
                        p.writeNext() << "null";
                    }
                    p.writeNext();
                    auto item_og = item.second.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.second.write_json(json_version, p);
                    }
                    next = ++key;
                }
                for (int j = next; j < a.sp->size; ++j) {
                    p.writeNext() << "null";
                }
            } else {
                for (auto const& item: a.elements) {
                    p.writeNext();
                    auto item_og = item.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.write_json(json_version, p);
                    }
                }
            }
            p.writeEnd(']');
        }
        break;
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            p.writeStart('{');
            for (auto& iter: d.items) {
                if (!iter.second.null()) {
                    p.writeNext();
                    if (json_version == 1) {
                        p << "\"" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    } else if (auto res = Name::analyzeJSONEncoding(iter.first); res.first) {
                        if (res.second) {
                            p << "\"" << iter.first << "\": ";
                        } else {
                            p << "\"" << JSON::Writer::encode_string(iter.first) << "\": ";
                        }
                    } else {
                        p << "\"n:" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    }
                    iter.second.writeJSON(json_version, p);
                }
            }
            p.writeEnd('}');
        }
        break;
    case ::ot_stream:
        std::get<QPDF_Stream>(obj->value).m->stream_dict.writeJSON(json_version, p);
        break;
    case ::ot_reference:
        p << "\"" << obj->og.unparse(' ') << " R\"";
        break;
    default:
        throw std::logic_error("attempted to write an unsuitable object as JSON");
    }
}